

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O0

int __thiscall VC1StreamReader::decodeFrame(VC1StreamReader *this,uint8_t *buff)

{
  long lVar1;
  BitStreamReader *pBVar2;
  long local_50;
  int64_t pcrIncVal;
  int64_t bTiming;
  int nextBFrameCnt;
  int rez;
  uint8_t *buff_local;
  VC1StreamReader *this_local;
  
  if (this->m_spsFound == 0) {
    this_local._4_4_ = 1;
  }
  else {
    _nextBFrameCnt = buff;
    buff_local = (uint8_t *)this;
    bTiming._4_4_ =
         VC1Frame::decode_frame_direct
                   (&this->m_frame,&this->m_sequence,buff + 1,
                    (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
    this_local._4_4_ = bTiming._4_4_;
    if (bTiming._4_4_ == 0) {
      bTiming._0_4_ = 0;
      pcrIncVal = 0;
      if (((this->m_sequence).max_b_frames == '\0') ||
         ((((this->m_frame).pict_type != I_TYPE && ((this->m_frame).pict_type != P_TYPE)) ||
          (bTiming._0_4_ = getNextBFrames(this,_nextBFrameCnt,&pcrIncVal), (int)bTiming != -1)))) {
        this->m_lastIFrame = (this->m_frame).pict_type == I_TYPE;
        (this->super_MPEGStreamReader).m_totalFrameNum =
             (this->super_MPEGStreamReader).m_totalFrameNum + 1;
        (this->super_MPEGStreamReader).m_curDts =
             this->m_prevDtsInc + (this->super_MPEGStreamReader).m_curDts;
        lVar1 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
        if ((this->m_sequence).pulldown == 0) {
          this->m_prevDtsInc = lVar1;
        }
        else if ((((this->m_sequence).interlace & 1U) == 0) || ((this->m_sequence).psf != 0)) {
          this->m_prevDtsInc = lVar1 * ((ulong)(this->m_frame).rptfrm + 1);
        }
        else {
          if ((this->m_frame).rff == 0) {
            local_50 = 0;
          }
          else {
            local_50 = (this->super_MPEGStreamReader).m_pcrIncPerField;
          }
          this->m_prevDtsInc = lVar1 + local_50;
        }
        if (((this->super_MPEGStreamReader).m_removePulldown & 1U) != 0) {
          MPEGStreamReader::checkPulldownSync(&this->super_MPEGStreamReader);
          (this->super_MPEGStreamReader).m_testPulldownDts =
               this->m_prevDtsInc + (this->super_MPEGStreamReader).m_testPulldownDts;
          this->m_prevDtsInc = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
          if ((this->m_sequence).pulldown != 0) {
            if ((((this->m_sequence).interlace & 1U) == 0) || ((this->m_sequence).psf != 0)) {
              if ((this->m_frame).rptfrm != '\0') {
                pBVar2 = VC1Unit::getBitReader(&(this->m_frame).super_VC1Unit);
                updateBits(pBVar2,(this->m_frame).rptfrmBitPos,2,0);
              }
              (this->m_frame).rptfrm = '\0';
            }
            else {
              if (0 < (this->m_frame).rff) {
                pBVar2 = VC1Unit::getBitReader(&(this->m_frame).super_VC1Unit);
                updateBits(pBVar2,(this->m_frame).rptfrmBitPos + 1,1,0);
              }
              (this->m_frame).rff = 0;
            }
          }
        }
        if (((this->m_frame).pict_type == I_TYPE) || ((this->m_frame).pict_type == P_TYPE)) {
          if (((this->super_MPEGStreamReader).m_removePulldown & 1U) == 0) {
            (this->super_MPEGStreamReader).m_curPts =
                 (this->super_MPEGStreamReader).m_curDts + pcrIncVal;
          }
          else {
            (this->super_MPEGStreamReader).m_curPts =
                 (this->super_MPEGStreamReader).m_curDts +
                 (long)(int)bTiming * (this->super_MPEGStreamReader).m_pcrIncPerFrame;
          }
        }
        else {
          (this->super_MPEGStreamReader).m_curPts =
               (this->super_MPEGStreamReader).m_curDts -
               (this->super_MPEGStreamReader).m_pcrIncPerFrame;
        }
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = -10;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int VC1StreamReader::decodeFrame(uint8_t* buff)
{
    if (!m_spsFound)
        return NALUnit::SPS_OR_PPS_NOT_READY;
    const int rez = m_frame.decode_frame_direct(m_sequence, buff + 1, m_bufEnd);
    if (rez != 0)
        return rez;

    int nextBFrameCnt = 0;
    int64_t bTiming = 0;
    if (m_sequence.max_b_frames > 0 &&
        (m_frame.pict_type == VC1PictType::I_TYPE || m_frame.pict_type == VC1PictType::P_TYPE))
    {
        nextBFrameCnt = getNextBFrames(buff, bTiming);
        if (nextBFrameCnt == -1)
            return NOT_ENOUGH_BUFFER;
    }

    m_lastIFrame = m_frame.pict_type == VC1PictType::I_TYPE;
    m_totalFrameNum++;

    m_curDts += m_prevDtsInc;

    const int64_t pcrIncVal = m_pcrIncPerFrame;
    // if (m_frame.fcm == 2) // coded field
    //	pcrIncVal = m_pcrIncPerField;

    if (m_sequence.pulldown)
    {
        if (!m_sequence.interlace || m_sequence.psf)
        {
            m_prevDtsInc = pcrIncVal * (static_cast<int64_t>(m_frame.rptfrm) + 1);
        }
        else
        {
            m_prevDtsInc = pcrIncVal + (m_frame.rff ? m_pcrIncPerField : 0);
        }
    }
    else
        m_prevDtsInc = pcrIncVal;

    if (m_removePulldown)
    {
        checkPulldownSync();
        m_testPulldownDts += m_prevDtsInc;

        m_prevDtsInc = m_pcrIncPerFrame;
        if (m_sequence.pulldown)
        {
            if (!m_sequence.interlace || m_sequence.psf)
            {
                if (m_frame.rptfrm > 0)
                    updateBits(m_frame.getBitReader(), m_frame.rptfrmBitPos, 2, 0);
                m_frame.rptfrm = 0;
            }
            else
            {
                if (m_frame.rff > 0)
                    updateBits(m_frame.getBitReader(), m_frame.rptfrmBitPos + 1, 1, 0);
                m_frame.rff = 0;
            }
        }
        /*
        if (m_frame.fcm == 2) {
                m_frame.fcm = 1;
                buff[1] &= 0xbf; // 1011 1111 set fcm to 1
        }
        */
    }

    if (m_frame.pict_type == VC1PictType::I_TYPE || m_frame.pict_type == VC1PictType::P_TYPE)
    {
        if (m_removePulldown)
            m_curPts = m_curDts + (nextBFrameCnt)*m_pcrIncPerFrame;
        else
            m_curPts = m_curDts + bTiming;
    }
    else
        m_curPts = m_curDts - m_pcrIncPerFrame;  // pcrInc;
    return 0;
}